

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O2

qsizetype QtPrivate::indexOf<QByteArray,char[2]>
                    (QList<QByteArray> *vector,char (*u) [2],qsizetype from)

{
  ulong uVar1;
  long lVar2;
  bool bVar3;
  qsizetype qVar4;
  ulong uVar5;
  long lVar6;
  QByteArray *lhs;
  long lVar7;
  long in_FS_OFFSET;
  char (*local_40) [2];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = (vector->d).size;
  uVar5 = from;
  if (from < 0) {
    uVar5 = from + uVar1;
    if ((long)(from + uVar1) < 1) {
      uVar5 = 0;
    }
  }
  qVar4 = -1;
  if (uVar5 < uVar1) {
    lhs = (vector->d).ptr + uVar5;
    lVar7 = uVar1 * 0x18 + uVar5 * -0x18;
    lVar2 = 0x18 - (long)lhs;
    do {
      lVar6 = lVar2;
      if (lVar7 == 0) {
        qVar4 = -1;
        goto LAB_00299dcb;
      }
      local_40 = u;
      bVar3 = ::operator==(lhs,(char **)&local_40);
      lhs = lhs + 1;
      lVar7 = lVar7 + -0x18;
      lVar2 = lVar6 + -0x18;
    } while (!bVar3);
    qVar4 = -((long)&(vector->d).ptr[-1].d.d + lVar6) / 0x18;
  }
LAB_00299dcb:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return qVar4;
  }
  __stack_chk_fail();
}

Assistant:

qsizetype indexOf(const QList<T> &vector, const U &u, qsizetype from) noexcept
{
    if (from < 0)
        from = qMax(from + vector.size(), qsizetype(0));
    if (from < vector.size()) {
        auto n = vector.begin() + from - 1;
        auto e = vector.end();
        while (++n != e)
            if (*n == u)
                return qsizetype(n - vector.begin());
    }
    return -1;
}